

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_Scream(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  AActor *ent;
  PClass *pPVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  PClass *pPVar3;
  FSoundID *sound_id;
  char *__assertion;
  bool bVar4;
  float attenuation;
  undefined8 local_18;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  sound_id = (FSoundID *)&local_18;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      ent = (AActor *)(param->field_0).field_1.a;
      local_18 = in_RAX;
      if (ent != (AActor *)0x0) {
        if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (ent->super_DThinker).super_DObject.Class;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar4) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar4 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f4fae;
        }
      }
      iVar2 = (ent->DeathSound).super_FSoundID.ID;
      if (iVar2 != 0) {
        if (((ent->flags2).Value & 0x8000) == 0) {
          local_18 = CONCAT44(local_18._4_4_,iVar2);
          attenuation = 1.0;
        }
        else {
          sound_id = (FSoundID *)((long)&local_18 + 4);
          local_18 = CONCAT44(iVar2,local_18._0_4_);
          attenuation = 0.0;
        }
        S_Sound(ent,2,sound_id,1.0,attenuation);
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f4fae:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc62,"int AF_AActor_A_Scream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Scream)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->DeathSound)
	{
		// Check for bosses.
		if (self->flags2 & MF2_BOSS)
		{
			// full volume
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NORM);
		}
	}
	return 0;
}